

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlBase64.c
# Opt level: O0

void Encode3BytesToBase64(uint8_t *ThreeByteBlock,char *FourCharBlock)

{
  char *FourCharBlock_local;
  uint8_t *ThreeByteBlock_local;
  
  *FourCharBlock = (char)((int)(uint)*ThreeByteBlock >> 2);
  FourCharBlock[1] = (*ThreeByteBlock & 3) << 4 | (byte)((int)(uint)ThreeByteBlock[1] >> 4);
  FourCharBlock[2] = (ThreeByteBlock[1] & 0xf) << 2 | (byte)((int)(uint)ThreeByteBlock[2] >> 6);
  FourCharBlock[3] = ThreeByteBlock[2] & 0x3f;
  *FourCharBlock = BASE64CHARSET[(int)*FourCharBlock];
  FourCharBlock[1] = BASE64CHARSET[(int)FourCharBlock[1]];
  FourCharBlock[2] = BASE64CHARSET[(int)FourCharBlock[2]];
  FourCharBlock[3] = BASE64CHARSET[(int)FourCharBlock[3]];
  return;
}

Assistant:

void
    Encode3BytesToBase64
    (
        uint8_t const*      ThreeByteBlock,         // [in]
        char*               FourCharBlock           // [out]
    )
{
    // Take 6 bits at a time from the three byte block and put them into the 4 character block
    FourCharBlock[0] = ThreeByteBlock[0] >> 2;
    FourCharBlock[1] = ((ThreeByteBlock[0] & 0x03) << 4) | (ThreeByteBlock[1] >> 4);
    FourCharBlock[2] = ((ThreeByteBlock[1] & 0x0f) << 2) | (ThreeByteBlock[2] >> 6);
    FourCharBlock[3] = (ThreeByteBlock[2] & 0x3f);

    // Now use the 6 bit values as indices into the base64 character set
    FourCharBlock[0] = BASE64CHARSET[ (int)FourCharBlock[0] ];
    FourCharBlock[1] = BASE64CHARSET[ (int)FourCharBlock[1] ];
    FourCharBlock[2] = BASE64CHARSET[ (int)FourCharBlock[2] ];
    FourCharBlock[3] = BASE64CHARSET[ (int)FourCharBlock[3] ];
}